

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

UObject * __thiscall
icu_63::CFactory::create(CFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  int iVar1;
  UObject *pUVar2;
  LocaleKey *lkey;
  Locale validLoc;
  Locale LStack_f8;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject[6])
                    (this,key,status);
  if ((char)iVar1 == '\0') {
    pUVar2 = (UObject *)0x0;
  }
  else {
    Locale::Locale(&LStack_f8);
    (*(key->super_UObject)._vptr_UObject[0xc])(key,&LStack_f8);
    iVar1 = (*(this->_delegate->super_UObject)._vptr_UObject[4])(this->_delegate,&LStack_f8);
    pUVar2 = (UObject *)CONCAT44(extraout_var,iVar1);
    Locale::~Locale(&LStack_f8);
  }
  return pUVar2;
}

Assistant:

UObject* 
CFactory::create(const ICUServiceKey& key, const ICUService* /* service */, UErrorCode& status) const
{
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        Locale validLoc;
        lkey.currentLocale(validLoc);
        return _delegate->createCollator(validLoc);
    }
    return NULL;
}